

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O3

void OPENSSL_lh_free(_LHASH *lh)

{
  lhash_item_st *plVar1;
  ulong uVar2;
  LHASH_ITEM *orig_ptr;
  ulong uVar3;
  
  if (lh != (_LHASH *)0x0) {
    uVar2 = lh->num_buckets;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        orig_ptr = lh->buckets[uVar3];
        if (lh->buckets[uVar3] != (LHASH_ITEM *)0x0) {
          do {
            plVar1 = orig_ptr->next;
            OPENSSL_free(orig_ptr);
            orig_ptr = plVar1;
          } while (plVar1 != (lhash_item_st *)0x0);
          uVar2 = lh->num_buckets;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar2);
    }
    OPENSSL_free(lh->buckets);
    OPENSSL_free(lh);
    return;
  }
  return;
}

Assistant:

void OPENSSL_lh_free(_LHASH *lh) {
  if (lh == NULL) {
    return;
  }

  for (size_t i = 0; i < lh->num_buckets; i++) {
    LHASH_ITEM *next;
    for (LHASH_ITEM *n = lh->buckets[i]; n != NULL; n = next) {
      next = n->next;
      OPENSSL_free(n);
    }
  }

  OPENSSL_free(lh->buckets);
  OPENSSL_free(lh);
}